

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Reference __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadReference(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                *this)

{
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_10;
  
  local_10.field_1.values_ = (Value *)&local_28;
  this_00 = this->reader_;
  pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
  if (*pcVar1 == 'v') {
    ReadUInt(this,this->num_vars_and_exprs_);
    return (Reference)NULL_ID;
  }
  local_28 = 0;
  uStack_20 = 0;
  local_10.types_ = 0;
  BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)0x260083,&local_10);
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }